

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O1

Promise<void> __thiscall kj::UnixEventPort::FdObserver::whenWriteDisconnected(FdObserver *this)

{
  undefined8 *puVar1;
  long *plVar2;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar3;
  long in_RSI;
  Promise<void> PVar4;
  PromiseFulfillerPair<void> paf;
  UnixEventPort *local_38;
  undefined8 local_30;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  newPromiseAndFulfiller<void>();
  puVar1 = *(undefined8 **)(in_RSI + 0x40);
  plVar2 = *(long **)(in_RSI + 0x48);
  *(undefined4 *)(in_RSI + 0x40) = local_28;
  *(undefined4 *)(in_RSI + 0x44) = uStack_24;
  *(undefined4 *)(in_RSI + 0x48) = uStack_20;
  *(undefined4 *)(in_RSI + 0x4c) = uStack_1c;
  pPVar3 = extraout_RDX;
  if (plVar2 != (long *)0x0) {
    (**(code **)*puVar1)(puVar1,(long)plVar2 + *(long *)(*plVar2 + -0x10));
    pPVar3 = extraout_RDX_00;
  }
  this->eventPort = local_38;
  this->fd = (undefined4)local_30;
  this->flags = local_30._4_4_;
  PVar4.super_PromiseBase.node.ptr = pPVar3;
  PVar4.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar4.super_PromiseBase.node;
}

Assistant:

Promise<void> UnixEventPort::FdObserver::whenWriteDisconnected() {
  auto paf = newPromiseAndFulfiller<void>();
  hupFulfiller = kj::mv(paf.fulfiller);
  return kj::mv(paf.promise);
}